

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

IRNode * __thiscall kratos::AssignStmt::get_child(AssignStmt *this,uint64_t index)

{
  uint64_t index_local;
  AssignStmt *this_local;
  
  if (index == 0) {
    this_local = (AssignStmt *)this->left_;
  }
  else if (index == 1) {
    this_local = (AssignStmt *)this->right_;
  }
  else {
    this_local = (AssignStmt *)0x0;
  }
  return (IRNode *)this_local;
}

Assistant:

IRNode *AssignStmt::get_child(uint64_t index) {
    if (index == 0)
        return left_;
    else if (index == 1)
        return right_;
    else
        return nullptr;
}